

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O2

void __thiscall
sznet::net::EventLoopThreadPool::start(EventLoopThreadPool *this,ThreadInitCallback *cb)

{
  EventLoopThread *this_00;
  uint uVar1;
  string local_80;
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> vbuf;
  allocator local_31;
  
  if (this->m_started != true) {
    EventLoop::assertInLoopThread(this->m_baseLoop);
    this->m_started = true;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_60,
               (this->m_name)._M_string_length + 0x20,(allocator_type *)&local_80);
    vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&this->m_threads;
    for (uVar1 = 0; (int)uVar1 < this->m_numThreads; uVar1 = uVar1 + 1) {
      snprintf((char *)local_60,
               (long)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)local_60,"%s%d",
               (this->m_name)._M_dataplus._M_p,(ulong)uVar1);
      this_00 = (EventLoopThread *)operator_new(0x168);
      std::__cxx11::string::string((string *)&local_80,(char *)local_60,&local_31);
      EventLoopThread::EventLoopThread(this_00,cb,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      local_80._M_dataplus._M_p = (pointer)this_00;
      std::
      vector<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>>>
      ::
      emplace_back<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>>
                ((vector<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>>>
                  *)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                 (unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>
                  *)&local_80);
      std::
      unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>::
      ~unique_ptr((unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>
                   *)&local_80);
      local_80._M_dataplus._M_p = (pointer)EventLoopThread::startLoop(this_00);
      std::vector<sznet::net::EventLoop*,std::allocator<sznet::net::EventLoop*>>::
      emplace_back<sznet::net::EventLoop*>
                ((vector<sznet::net::EventLoop*,std::allocator<sznet::net::EventLoop*>> *)
                 &this->m_loops,(EventLoop **)&local_80);
    }
    if ((this->m_numThreads == 0) && ((cb->super__Function_base)._M_manager != (_Manager_type)0x0))
    {
      std::function<void_(sznet::net::EventLoop_*)>::operator()(cb,this->m_baseLoop);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_60);
    return;
  }
  __assert_fail("!m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoopThreadPool.cpp"
                ,0x1d,"void sznet::net::EventLoopThreadPool::start(const ThreadInitCallback &)");
}

Assistant:

void EventLoopThreadPool::start(const ThreadInitCallback& cb)
{
	assert(!m_started);
	m_baseLoop->assertInLoopThread();
	m_started = true;

	std::vector<char> vbuf(m_name.size() + 32);
	for (int i = 0; i < m_numThreads; ++i)
	{
		snprintf(vbuf.data(), vbuf.size(), "%s%d", m_name.c_str(), i);
		EventLoopThread* t = new EventLoopThread(cb, vbuf.data());
		m_threads.push_back(std::unique_ptr<EventLoopThread>(t));
		// 阻塞
		// 启动EventLoopThread线程，在进入事件循环之前，会调用cb
		m_loops.push_back(t->startLoop());
	}
	// 只有一个EventLoop，在这个EventLoop进入事件循环之前，调用cb
	if (m_numThreads == 0 && cb)
	{
		cb(m_baseLoop);
	}
}